

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall bsplib::Rdma::push_reg(Rdma *this,void *addr,size_t size)

{
  pointer puVar1;
  pointer pMVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  mapped_type *this_00;
  long lVar7;
  size_type __new_size;
  ulong local_60;
  void *addr_local;
  value_type local_50;
  
  puVar1 = (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  addr_local = addr;
  if ((this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start == puVar1) {
    pMVar2 = (this->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->m_used_slots).
                   super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x18;
    uVar4 = uVar3 / (ulong)(long)this->m_nprocs;
    uVar5 = ((long)(this->m_used_slots).
                   super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar2) / 0x18;
    __new_size = uVar3 + (long)this->m_nprocs;
    local_60 = uVar4;
    if (uVar5 < __new_size) {
      uVar5 = uVar5 * 2;
      if (uVar5 <= __new_size) {
        uVar5 = __new_size;
      }
      std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::reserve
                (&this->m_used_slots,uVar5);
      __new_size = ((long)(this->m_used_slots).
                          super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_used_slots).
                         super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18 + (long)this->m_nprocs;
    }
    std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::resize
              (&this->m_used_slots,__new_size);
  }
  else {
    uVar4 = puVar1[-1];
    (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1 + -1;
    local_60 = uVar4;
  }
  lVar6 = (long)this->m_pid;
  lVar7 = (long)this->m_nprocs * uVar4;
  pMVar2 = (this->m_used_slots).
           super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar2[lVar7 + lVar6].addr = addr;
  pMVar2[lVar7 + lVar6].size = size;
  pMVar2[lVar7 + lVar6].status = 1;
  this_00 = std::__detail::
            _Map_base<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->m_register,&addr_local);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&local_60);
  local_50.slot = local_60;
  local_50.block.addr = addr;
  local_50.block.size = size;
  local_50.block.status = 1;
  std::
  vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
  ::push_back(&(this->m_send_push_pop_comm_buf).m_pushed_slots,&local_50);
  return;
}

Assistant:

void Rdma::push_reg( void * addr, size_t size )
{
    Memslot id = no_slot();
    if ( m_free_slots.empty() ) {
        id = m_used_slots.size() / m_nprocs;

        if ( m_used_slots.capacity() < m_used_slots.size() + m_nprocs )
            m_used_slots.reserve( std::max(
                        2*m_used_slots.capacity(),
                        m_used_slots.size() + m_nprocs ) );

        m_used_slots.resize( m_used_slots.size() + m_nprocs );
    }
    else {
        id = m_free_slots.back();
        m_free_slots.pop_back();
    }

    Memblock block = { addr, size, Memblock::PUSHED };
    slot( m_pid, id ) = block;
    m_register[ addr ].push_back( id );

    PushPopCommBuf::PushEntry entry = { block, id };
    m_send_push_pop_comm_buf.m_pushed_slots.push_back( entry );
}